

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall
ChainstateManager::LoadExternalBlockFile
          (ChainstateManager *this,AutoFile *file_in,FlatFilePos *dbp,
          multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
          *blocks_with_unknown_parent)

{
  CBlock *block;
  BlockManager *this_00;
  _Elt_pointer *ppuVar1;
  CChainParams *__nbytes;
  Chainstate *this_01;
  pointer ppCVar2;
  pointer ppCVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  iterator __position;
  base_blob<256U> *pbVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  void *__s;
  CBlockIndex *pCVar15;
  Logger *pLVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  _Base_ptr p_Var18;
  long lVar19;
  size_t __nbytes_00;
  _Elt_pointer puVar20;
  pointer ppCVar21;
  _Self __tmp;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view source_file;
  string_view source_file_00;
  shared_ptr<const_CBlock> pblock;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>_>
  pVar28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  uint64_t local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_240;
  undefined1 local_228 [16];
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_210;
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [16];
  pointer local_1c0;
  int nLoaded;
  TransactionSerParams *local_1b0;
  undefined1 *local_1a8;
  BlockValidationState dummy;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  undefined1 local_148 [16];
  uint256 local_138;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  deque<uint256,_std::allocator<uint256>_> queue;
  uint32_t obj;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  uchar uStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  uchar uStack_99;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  uchar uStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  uchar uStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  uchar uStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  uchar uStack_89;
  MessageStartChars buf;
  undefined1 auStack_84 [12];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dbp != (FlatFilePos *)0x0) !=
      (blocks_with_unknown_parent !=
      (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
       *)0x0)) {
    __assert_fail("!dbp == !blocks_with_unknown_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x139f,
                  "void ChainstateManager::LoadExternalBlockFile(AutoFile &, FlatFilePos *, std::multimap<uint256, FlatFilePos> *)"
                 );
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  __nbytes = (this->m_options).chainparams;
  nLoaded = 0;
  local_1f8._8_8_ = 0;
  local_1f8._16_8_ = 0;
  local_1f8._24_8_ = 0xffffffffffffffff;
  local_1f8._32_8_ = 0x3d0908;
  local_1d0 = (undefined1  [16])0x0;
  local_1c0 = (pointer)0x0;
  local_1f8._0_8_ = file_in;
  __s = operator_new(8000000);
  local_1d0._0_8_ = __s;
  local_1c0 = (pointer)((long)__s + 8000000);
  memset(__s,0,8000000);
  local_1d0._8_8_ = (pointer)((long)__s + 8000000);
  this_00 = &this->m_blockman;
  local_288 = local_1f8._16_8_;
  do {
    do {
      do {
        if ((local_1f8._16_8_ == local_1f8._8_8_) &&
           (iVar13 = feof((FILE *)*(FILE **)local_1f8._0_8_), iVar13 != 0)) goto LAB_00402886;
        bVar10 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
        if (bVar10) {
          if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_1d0._0_8_,(long)local_1c0 - local_1d0._0_8_);
          }
          goto LAB_00402917;
        }
        __nbytes_00 = (local_1d0._8_8_ - local_1d0._0_8_) + local_288;
        if ((ulong)local_1f8._8_8_ < local_288) {
          local_288 = local_1f8._8_8_;
        }
        local_1f8._16_8_ = local_288;
        if (__nbytes_00 < (ulong)local_1f8._8_8_) {
          local_1f8._16_8_ = local_1f8._8_8_ - (local_1d0._8_8_ - local_1d0._0_8_);
        }
        local_1f8._24_8_ = 0xffffffffffffffff;
        BufferedFile::FindByte((BufferedFile *)local_1f8,(__nbytes->pchMessageStart)._M_elems[0]);
        uVar9 = local_1f8._16_8_;
        BufferedFile::read((BufferedFile *)local_1f8,(int)&buf,(void *)0x4,__nbytes_00);
        local_288 = uVar9 + 1;
      } while (buf._M_elems != *&(__nbytes->pchMessageStart)._M_elems);
      BufferedFile::read((BufferedFile *)local_1f8,(int)&obj,(void *)0x4,(size_t)__nbytes);
      uVar9 = local_1f8._16_8_;
      uVar4 = CONCAT13(obj._3_1_,CONCAT12(obj._2_1_,CONCAT11(obj._1_1_,(uchar)obj)));
    } while (0x3d08b0 < uVar4 - 0x50);
    if (dbp != (FlatFilePos *)0x0) {
      dbp->nPos = (uint)local_1f8._16_8_;
    }
    local_288 = (ulong)uVar4 + local_1f8._16_8_;
    if (!CARRY8((ulong)uVar4,local_1f8._16_8_)) {
      local_1f8._24_8_ = local_288;
    }
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    _buf = (undefined1  [16])0x0;
    ActionUnserialize::
    SerReadWriteMany<BufferedFile,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
              ((BufferedFile *)local_1f8,(int *)&buf,(uint256 *)auStack_84,(uint256 *)(local_68 + 4)
               ,(uint *)(local_48 + 4),(uint *)(local_48 + 8),(uint *)(local_48 + 0xc));
    CBlockHeader::GetHash((uint256 *)&obj,(CBlockHeader *)&buf);
    BufferedFile::SkipTo((BufferedFile *)local_1f8,local_288);
    criticalblock38.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock38.super_unique_lock._8_8_ =
         criticalblock38.super_unique_lock._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock38.super_unique_lock);
    auVar25[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0]
                  == (uchar)obj);
    auVar25[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[1]
                  == obj._1_1_);
    auVar25[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[2]
                  == obj._2_1_);
    auVar25[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[3]
                  == obj._3_1_);
    auVar25[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[4]
                  == uStack_a4);
    auVar25[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[5]
                  == uStack_a3);
    auVar25[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[6]
                  == uStack_a2);
    auVar25[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[7]
                  == uStack_a1);
    auVar25[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[8]
                  == uStack_a0);
    auVar25[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[9]
                  == uStack_9f);
    auVar25[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[10]
                   == uStack_9e);
    auVar25[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0xb] == uStack_9d);
    auVar25[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0xc] == uStack_9c);
    auVar25[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0xd] == uStack_9b);
    auVar25[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0xe] == uStack_9a);
    auVar25[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0xf] == uStack_99);
    auVar22[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x10] == local_98);
    auVar22[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x11] == uStack_97);
    auVar22[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x12] == uStack_96);
    auVar22[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x13] == uStack_95);
    auVar22[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x14] == uStack_94);
    auVar22[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x15] == uStack_93);
    auVar22[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x16] == uStack_92);
    auVar22[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x17] == uStack_91);
    auVar22[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x18] == uStack_90);
    auVar22[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                   [0x19] == uStack_8f);
    auVar22[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                    [0x1a] == uStack_8e);
    auVar22[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x1b] == uStack_8d);
    auVar22[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x1c] == uStack_8c);
    auVar22[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x1d] == uStack_8b);
    auVar22[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x1e] == uStack_8a);
    auVar22[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x1f] == uStack_89);
    auVar22 = auVar22 & auVar25;
    if (((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) ||
       (pCVar15 = ::node::BlockManager::LookupBlockIndex(this_00,(uint256 *)auStack_84),
       pCVar15 != (CBlockIndex *)0x0)) {
      pCVar15 = ::node::BlockManager::LookupBlockIndex(this_00,(uint256 *)&obj);
      if ((pCVar15 == (CBlockIndex *)0x0) || ((pCVar15->nStatus & 8) == 0)) {
        local_1f8._16_8_ = uVar9;
        if ((ulong)local_1f8._8_8_ < (ulong)uVar9) {
          local_1f8._16_8_ = local_1f8._8_8_;
        }
        if ((ulong)((local_1d0._8_8_ - local_1d0._0_8_) + uVar9) < (ulong)local_1f8._8_8_) {
          local_1f8._16_8_ = local_1f8._8_8_ - (local_1d0._8_8_ - local_1d0._0_8_);
        }
        local_2a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
        local_2a0->_M_use_count = 1;
        local_2a0->_M_weak_count = 1;
        local_2a0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00afb0b8;
        p_Var17 = local_2a0 + 1;
        *(undefined2 *)((long)&local_2a0[7]._M_use_count + 1) = 0;
        local_2a0[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_2a0[1]._M_use_count = 0;
        local_2a0[1]._M_weak_count = 0;
        local_2a0[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_2a0[2]._M_use_count = 0;
        local_2a0[2]._M_weak_count = 0;
        local_2a0[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_2a0[3]._M_use_count = 0;
        local_2a0[3]._M_weak_count = 0;
        local_2a0[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_2a0[4]._M_use_count = 0;
        local_2a0[4]._M_weak_count = 0;
        local_2a0[5]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_2a0[5]._M_use_count = 0;
        local_2a0[5]._M_weak_count = 0;
        local_2a0[6]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_2a0[6]._M_use_count = 0;
        local_2a0[6]._M_weak_count = 0;
        local_2a0[7]._vptr__Sp_counted_base = (_func_int **)0x0;
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)(local_2a0 + 6));
        *(undefined2 *)&local_2a0[7]._M_use_count = 0;
        *(undefined1 *)((long)&local_2a0[7]._M_use_count + 2) = 0;
        local_1b0 = &::TX_WITH_WITNESS;
        local_1a8 = local_1f8;
        CBlock::
        SerializationOps<ParamsStream<BufferedFile&,TransactionSerParams>,CBlock,ActionUnserialize>
                  (p_Var17,&local_1b0);
        local_288 = local_1f8._16_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _0_16_ = auVar5 << 0x40;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_start._0_9_ = ZEXT89(0);
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node =
             &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_finish._0_9_ = ZEXT89(0);
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
        }
        dummy.super_ValidationState<BlockValidationResult>._0_8_ = p_Var17;
        dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)local_2a0;
        bVar10 = AcceptBlock(this,(shared_ptr<const_CBlock> *)&dummy,(BlockValidationState *)&queue,
                             (CBlockIndex **)0x0,true,dbp,(bool *)0x0,true);
        if (dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
            (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                     _M_p);
        }
        if (bVar10) {
          nLoaded = nLoaded + 1;
        }
        iVar13 = (int)queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Deque_impl_data._M_map;
        if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_node !=
            &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first) {
          operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node,
                          (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_first)->
                                  super_base_blob<256U>).m_data._M_elems + 1));
        }
        if ((_Elt_pointer *)
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map_size !=
            &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Deque_impl_data._M_start._M_first) {
          operator_delete((void *)queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl
                                  .super__Deque_impl_data._M_map_size,
                          (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_first)->
                                  super_base_blob<256U>).m_data._M_elems + 1));
        }
        if (iVar13 != 2) goto LAB_00401be5;
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock38.super_unique_lock);
        iVar13 = 3;
      }
      else {
        auVar26[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0] == (uchar)obj);
        auVar26[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [1] == obj._1_1_);
        auVar26[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [2] == obj._2_1_);
        auVar26[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [3] == obj._3_1_);
        auVar26[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [4] == uStack_a4);
        auVar26[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [5] == uStack_a3);
        auVar26[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [6] == uStack_a2);
        auVar26[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [7] == uStack_a1);
        auVar26[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [8] == uStack_a0);
        auVar26[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [9] == uStack_9f);
        auVar26[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                        [10] == uStack_9e);
        auVar26[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xb] == uStack_9d);
        auVar26[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xc] == uStack_9c);
        auVar26[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xd] == uStack_9b);
        auVar26[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xe] == uStack_9a);
        auVar26[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xf] == uStack_99);
        auVar23[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x10] == local_98);
        auVar23[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x11] == uStack_97);
        auVar23[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x12] == uStack_96);
        auVar23[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x13] == uStack_95);
        auVar23[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x14] == uStack_94);
        auVar23[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x15] == uStack_93);
        auVar23[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x16] == uStack_92);
        auVar23[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x17] == uStack_91);
        auVar23[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x18] == uStack_90);
        auVar23[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x19] == uStack_8f);
        auVar23[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                        [0x1a] == uStack_8e);
        auVar23[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1b] == uStack_8d);
        auVar23[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1c] == uStack_8c);
        auVar23[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1d] == uStack_8b);
        auVar23[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1e] == uStack_8a);
        auVar23[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1f] == uStack_89);
        auVar23 = auVar23 & auVar26;
        if (((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) &&
           ((pCVar15->nHeight * 0x26e978d5 + 0x10624d8U >> 3 | pCVar15->nHeight * -0x60000000) <
            0x418937)) {
          pLVar16 = LogInstance();
          bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar16,REINDEX,Debug);
          if (bVar10) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&queue,&obj);
            logging_function._M_str = "LoadExternalBlockFile";
            logging_function._M_len = 0x15;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file._M_len = 0x5e;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function,source_file,0x13f0,REINDEX,Debug,
                       (ConstevalFormatString<2U>)0x80f32f,(string *)&queue,&pCVar15->nHeight);
            if ((iterator *)
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_map !=
                &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Deque_impl_data._M_start) {
              operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                              super__Deque_impl_data._M_map,
                              (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                        _M_impl.super__Deque_impl_data._M_start._M_cur)->
                                      super_base_blob<256U>).m_data._M_elems + 1));
            }
          }
        }
        local_2a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00401be5:
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock38.super_unique_lock);
        auVar27[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0] == (uchar)obj);
        auVar27[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [1] == obj._1_1_);
        auVar27[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [2] == obj._2_1_);
        auVar27[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [3] == obj._3_1_);
        auVar27[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [4] == uStack_a4);
        auVar27[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [5] == uStack_a3);
        auVar27[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [6] == uStack_a2);
        auVar27[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [7] == uStack_a1);
        auVar27[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [8] == uStack_a0);
        auVar27[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [9] == uStack_9f);
        auVar27[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                        [10] == uStack_9e);
        auVar27[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xb] == uStack_9d);
        auVar27[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xc] == uStack_9c);
        auVar27[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xd] == uStack_9b);
        auVar27[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xe] == uStack_9a);
        auVar27[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xf] == uStack_99);
        auVar24[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x10] == local_98);
        auVar24[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x11] == uStack_97);
        auVar24[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x12] == uStack_96);
        auVar24[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x13] == uStack_95);
        auVar24[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x14] == uStack_94);
        auVar24[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x15] == uStack_93);
        auVar24[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x16] == uStack_92);
        auVar24[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x17] == uStack_91);
        auVar24[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x18] == uStack_90);
        auVar24[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x19] == uStack_8f);
        auVar24[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                        [0x1a] == uStack_8e);
        auVar24[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1b] == uStack_8d);
        auVar24[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1c] == uStack_8c);
        auVar24[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1d] == uStack_8b);
        auVar24[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1e] == uStack_8a);
        auVar24[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1f] == uStack_89);
        auVar24 = auVar24 & auVar27;
        if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
          GetAll(&local_210,this);
          ppCVar3 = local_210.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          ppCVar2 = local_210.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_210.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_210.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar10 = true;
          }
          else {
            do {
              ppCVar21 = ppCVar2 + 1;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first;
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._0_16_ = auVar6 << 0x40;
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_start._0_9_ = ZEXT89(0);
              ppuVar1 = &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_first;
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_start._M_node = ppuVar1;
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_finish._0_9_ = ZEXT89(0);
              local_228 = (undefined1  [16])0x0;
              pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_228;
              bVar10 = Chainstate::ActivateBestChain(*ppCVar2,(BlockValidationState *)&queue,pblock)
              ;
              if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node != ppuVar1) {
                operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                                super__Deque_impl_data._M_start._M_node,
                                (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>
                                          ._M_impl.super__Deque_impl_data._M_finish._M_first)->
                                        super_base_blob<256U>).m_data._M_elems + 1));
              }
              if ((_Elt_pointer *)
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_map_size !=
                  &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first) {
                operator_delete((void *)queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                        _M_impl.super__Deque_impl_data._M_map_size,
                                (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_first)->
                                        super_base_blob<256U>).m_data._M_elems + 1));
              }
              ppCVar2 = ppCVar21;
            } while (bVar10 && ppCVar21 != ppCVar3);
          }
          if (local_210.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_210.
                            super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_210.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_210.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          iVar13 = 3;
          if (bVar10 != false) goto LAB_00401d54;
        }
        else {
LAB_00401d54:
          if ((((this->m_blockman).m_prune_mode == true) &&
              (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
             (((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)) {
            GetAll(&local_240,this);
            ppCVar2 = local_240.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (local_240.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_240.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              bVar10 = false;
            }
            else {
              bVar10 = false;
              ppCVar3 = local_240.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                ppCVar21 = ppCVar3 + 1;
                this_01 = *ppCVar3;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                                super__Deque_impl_data._M_start._M_first;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._0_16_ = auVar7 << 0x40;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._0_9_ = ZEXT89(0);
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_node =
                     &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._0_9_ = ZEXT89(0);
                local_248 = local_2a0;
                if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
                  }
                }
                pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_250;
                local_250 = p_Var17;
                bVar11 = Chainstate::ActivateBestChain
                                   (this_01,(BlockValidationState *)&queue,pblock_00);
                if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
                }
                if (!bVar11) {
                  pLVar16 = LogInstance();
                  bVar12 = BCLog::Logger::WillLogCategoryLevel(pLVar16,REINDEX,Debug);
                  bVar10 = true;
                  if (bVar12) {
                    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                              ((string *)&dummy,(ValidationState<BlockValidationResult> *)&queue);
                    logging_function_01._M_str = "LoadExternalBlockFile";
                    logging_function_01._M_len = 0x15;
                    source_file_01._M_str =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ;
                    source_file_01._M_len = 0x5e;
                    LogPrintFormatInternal<std::__cxx11::string>
                              (logging_function_01,source_file_01,0x140f,REINDEX,Debug,
                               (ConstevalFormatString<1U>)0x7d4a91,(string *)&dummy);
                    if ((size_type *)dummy.super_ValidationState<BlockValidationResult>._0_8_ !=
                        &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_string_length) {
                      operator_delete((void *)dummy.super_ValidationState<BlockValidationResult>.
                                              _0_8_,
                                      dummy.super_ValidationState<BlockValidationResult>.
                                      m_reject_reason._M_string_length + 1);
                    }
                  }
                }
                if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node !=
                    &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl
                                  .super__Deque_impl_data._M_start._M_node,
                                  (ulong)(((queue.
                                            super__Deque_base<uint256,_std::allocator<uint256>_>.
                                            _M_impl.super__Deque_impl_data._M_finish._M_first)->
                                          super_base_blob<256U>).m_data._M_elems + 1));
                }
                if ((_Elt_pointer *)
                    queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_map_size !=
                    &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first) {
                  operator_delete((void *)queue.super__Deque_base<uint256,_std::allocator<uint256>_>
                                          ._M_impl.super__Deque_impl_data._M_map_size,
                                  (ulong)(((queue.
                                            super__Deque_base<uint256,_std::allocator<uint256>_>.
                                            _M_impl.super__Deque_impl_data._M_start._M_first)->
                                          super_base_blob<256U>).m_data._M_elems + 1));
                }
                ppCVar3 = ppCVar21;
              } while (bVar11 && ppCVar21 != ppCVar2);
            }
            if (local_240.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_240.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_240.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_240.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            iVar13 = 3;
            if (bVar10) goto LAB_00402417;
          }
          NotifyHeaderTip(this);
          if (blocks_with_unknown_parent ==
              (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
               *)0x0) {
            iVar13 = 2;
          }
          else {
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map_size = 0;
            std::_Deque_base<uint256,_std::allocator<uint256>_>::_M_initialize_map
                      (&queue.super__Deque_base<uint256,_std::allocator<uint256>_>,0);
            if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<uint256,std::allocator<uint256>>::_M_push_back_aux<uint256_const&>
                        ((deque<uint256,std::allocator<uint256>> *)&queue,(uint256 *)&obj);
              puVar20 = queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
            }
            else {
              *(ulong *)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                         _M_elems + 0x10) =
                   CONCAT17(uStack_91,
                            CONCAT16(uStack_92,
                                     CONCAT15(uStack_93,
                                              CONCAT14(uStack_94,
                                                       CONCAT13(uStack_95,
                                                                CONCAT12(uStack_96,
                                                                         CONCAT11(uStack_97,local_98
                                                                                 )))))));
              *(ulong *)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                         _M_elems + 0x18) =
                   CONCAT17(uStack_89,
                            CONCAT16(uStack_8a,
                                     CONCAT15(uStack_8b,
                                              CONCAT14(uStack_8c,
                                                       CONCAT13(uStack_8d,
                                                                CONCAT12(uStack_8e,
                                                                         CONCAT11(uStack_8f,
                                                                                  uStack_90)))))));
              *(ulong *)((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                        _M_elems =
                   CONCAT17(uStack_a1,
                            CONCAT16(uStack_a2,
                                     CONCAT15(uStack_a3,
                                              CONCAT14(uStack_a4,
                                                       CONCAT13(obj._3_1_,
                                                                CONCAT12(obj._2_1_,
                                                                         CONCAT11(obj._1_1_,
                                                                                  (uchar)obj)))))));
              *(ulong *)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                         _M_elems + 8) =
                   CONCAT17(uStack_99,
                            CONCAT16(uStack_9a,
                                     CONCAT15(uStack_9b,
                                              CONCAT14(uStack_9c,
                                                       CONCAT13(uStack_9d,
                                                                CONCAT12(uStack_9e,
                                                                         CONCAT11(uStack_9f,
                                                                                  uStack_a0)))))));
              puVar20 = queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur + 1;
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = puVar20;
            }
            if (puVar20 !=
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
              do {
                criticalblock38.super_unique_lock._M_device =
                     *(mutex_type **)
                      ((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur)->super_base_blob<256U>).m_data.
                      _M_elems;
                pbVar8 = &(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Deque_impl_data._M_start._M_cur)->super_base_blob<256U>;
                criticalblock38.super_unique_lock._M_owns = (bool)(pbVar8->m_data)._M_elems[8];
                criticalblock38.super_unique_lock._9_1_ = (pbVar8->m_data)._M_elems[9];
                criticalblock38.super_unique_lock._10_1_ = (pbVar8->m_data)._M_elems[10];
                criticalblock38.super_unique_lock._11_1_ = (pbVar8->m_data)._M_elems[0xb];
                criticalblock38.super_unique_lock._12_1_ = (pbVar8->m_data)._M_elems[0xc];
                criticalblock38.super_unique_lock._13_1_ = (pbVar8->m_data)._M_elems[0xd];
                criticalblock38.super_unique_lock._14_1_ = (pbVar8->m_data)._M_elems[0xe];
                criticalblock38.super_unique_lock._15_1_ = (pbVar8->m_data)._M_elems[0xf];
                if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur ==
                    queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_start._M_last + -1) {
                  operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl
                                  .super__Deque_impl_data._M_start._M_first,0x200);
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur =
                       queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[1];
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node =
                       queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node + 1;
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last =
                       queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 0x10;
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first =
                       queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur;
                }
                else {
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur =
                       queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 1;
                }
                pVar28 = std::
                         _Rb_tree<uint256,_std::pair<const_uint256,_FlatFilePos>,_std::_Select1st<std::pair<const_uint256,_FlatFilePos>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                         ::equal_range(&blocks_with_unknown_parent->_M_t,
                                       (key_type *)&criticalblock38);
                __position._M_node = pVar28.first._M_node._M_node;
                while (__position._M_node != pVar28.second._M_node._M_node) {
                  p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
                  p_Var17->_M_use_count = 1;
                  p_Var17->_M_weak_count = 1;
                  p_Var17->_vptr__Sp_counted_base =
                       (_func_int **)&PTR___Sp_counted_ptr_inplace_00afb0b8;
                  block = (CBlock *)(p_Var17 + 1);
                  *(undefined2 *)((long)&p_Var17[7]._M_use_count + 1) = 0;
                  p_Var17[1]._vptr__Sp_counted_base = (_func_int **)0x0;
                  p_Var17[1]._M_use_count = 0;
                  p_Var17[1]._M_weak_count = 0;
                  p_Var17[2]._vptr__Sp_counted_base = (_func_int **)0x0;
                  p_Var17[2]._M_use_count = 0;
                  p_Var17[2]._M_weak_count = 0;
                  p_Var17[3]._vptr__Sp_counted_base = (_func_int **)0x0;
                  p_Var17[3]._M_use_count = 0;
                  p_Var17[3]._M_weak_count = 0;
                  p_Var17[4]._vptr__Sp_counted_base = (_func_int **)0x0;
                  p_Var17[4]._M_use_count = 0;
                  p_Var17[4]._M_weak_count = 0;
                  p_Var17[5]._vptr__Sp_counted_base = (_func_int **)0x0;
                  p_Var17[5]._M_use_count = 0;
                  p_Var17[5]._M_weak_count = 0;
                  p_Var17[6]._vptr__Sp_counted_base = (_func_int **)0x0;
                  p_Var17[6]._M_use_count = 0;
                  p_Var17[6]._M_weak_count = 0;
                  p_Var17[7]._vptr__Sp_counted_base = (_func_int **)0x0;
                  std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           *)(p_Var17 + 6));
                  *(undefined2 *)&p_Var17[7]._M_use_count = 0;
                  *(undefined1 *)((long)&p_Var17[7]._M_use_count + 2) = 0;
                  bVar10 = ::node::BlockManager::ReadBlockFromDisk
                                     (this_00,block,(FlatFilePos *)(__position._M_node + 2));
                  if (bVar10) {
                    pLVar16 = LogInstance();
                    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar16,REINDEX,Debug);
                    if (bVar10) {
                      CBlockHeader::GetHash((uint256 *)(local_148 + 0x10),(CBlockHeader *)block);
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&dummy,(uint256 *)(local_148 + 0x10));
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&criticalblock39,&criticalblock38);
                      logging_function_02._M_str = "LoadExternalBlockFile";
                      logging_function_02._M_len = 0x15;
                      source_file_02._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ;
                      source_file_02._M_len = 0x5e;
                      LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                                (logging_function_02,source_file_02,0x1429,REINDEX,Debug,
                                 (ConstevalFormatString<3U>)0x80f360,
                                 (char (*) [22])"LoadExternalBlockFile",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&dummy,(string *)&criticalblock39);
                      if (criticalblock39.super_unique_lock._M_device != (mutex_type *)local_148) {
                        operator_delete(criticalblock39.super_unique_lock._M_device,
                                        local_148._0_8_ + 1);
                      }
                      if ((size_type *)dummy.super_ValidationState<BlockValidationResult>._0_8_ !=
                          &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                           _M_string_length) {
                        operator_delete((void *)dummy.super_ValidationState<BlockValidationResult>.
                                                _0_8_,
                                        dummy.super_ValidationState<BlockValidationResult>.
                                        m_reject_reason._M_string_length + 1);
                      }
                    }
                    criticalblock39.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
                    criticalblock39.super_unique_lock._M_owns = false;
                    std::unique_lock<std::recursive_mutex>::lock(&criticalblock39.super_unique_lock)
                    ;
                    dummy.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
                    dummy.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET
                    ;
                    dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                    _M_p = (pointer)&dummy.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2;
                    dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                    _M_string_length = 0;
                    dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                    _M_local_buf[0] = '\0';
                    dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus.
                    _M_p = (pointer)&dummy.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2;
                    dummy.super_ValidationState<BlockValidationResult>.m_debug_message.
                    _M_string_length = 0;
                    dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
                    _M_local_buf[0] = '\0';
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    }
                    local_138.super_base_blob<256U>.m_data._M_elems._0_8_ = block;
                    local_138.super_base_blob<256U>.m_data._M_elems._8_8_ = p_Var17;
                    bVar10 = AcceptBlock(this,(shared_ptr<const_CBlock> *)(local_148 + 0x10),&dummy,
                                         (CBlockIndex **)0x0,true,
                                         (FlatFilePos *)(__position._M_node + 2),(bool *)0x0,true);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_138.super_base_blob<256U>.m_data._M_elems._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_138.super_base_blob<256U>.m_data._M_elems._8_8_);
                    }
                    if (bVar10) {
                      nLoaded = nLoaded + 1;
                      CBlockHeader::GetHash((uint256 *)(local_148 + 0x10),(CBlockHeader *)block);
                      std::deque<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                                (&queue,(uint256 *)(local_148 + 0x10));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)dummy.super_ValidationState<BlockValidationResult>.m_debug_message.
                           _M_dataplus._M_p !=
                        &dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2)
                    {
                      operator_delete(dummy.super_ValidationState<BlockValidationResult>.
                                      m_debug_message._M_dataplus._M_p,
                                      CONCAT71(dummy.super_ValidationState<BlockValidationResult>.
                                               m_debug_message.field_2._M_allocated_capacity._1_7_,
                                               dummy.super_ValidationState<BlockValidationResult>.
                                               m_debug_message.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                           _M_dataplus._M_p !=
                        &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2)
                    {
                      operator_delete(dummy.super_ValidationState<BlockValidationResult>.
                                      m_reject_reason._M_dataplus._M_p,
                                      CONCAT71(dummy.super_ValidationState<BlockValidationResult>.
                                               m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                               dummy.super_ValidationState<BlockValidationResult>.
                                               m_reject_reason.field_2._M_local_buf[0]) + 1);
                    }
                    std::unique_lock<std::recursive_mutex>::~unique_lock
                              (&criticalblock39.super_unique_lock);
                  }
                  p_Var18 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                  ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                                      *)blocks_with_unknown_parent,__position);
                  NotifyHeaderTip(this);
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
                  __position._M_node = p_Var18;
                }
              } while (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur !=
                       queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur);
            }
            std::_Deque_base<uint256,_std::allocator<uint256>_>::~_Deque_base
                      (&queue.super__Deque_base<uint256,_std::allocator<uint256>_>);
            iVar13 = 0;
          }
        }
LAB_00402417:
        if (local_2a0 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00402426;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
    }
    else {
      pLVar16 = LogInstance();
      bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar16,REINDEX,Debug);
      if (bVar10) {
        base_blob<256u>::ToString_abi_cxx11_((string *)&queue,&obj);
        base_blob<256u>::ToString_abi_cxx11_((string *)&dummy,auStack_84);
        logging_function_00._M_str = "LoadExternalBlockFile";
        logging_function_00._M_len = 0x15;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_00._M_len = 0x5e;
        LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x13d8,REINDEX,Debug,
                   (ConstevalFormatString<3U>)0x80f2ff,(char (*) [22])"LoadExternalBlockFile",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queue,
                   (string *)&dummy);
        if ((size_type *)dummy.super_ValidationState<BlockValidationResult>._0_8_ !=
            &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length) {
          operator_delete((void *)dummy.super_ValidationState<BlockValidationResult>._0_8_,
                          dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_string_length + 1);
        }
        if ((iterator *)
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map !=
            &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Deque_impl_data._M_start) {
          operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Deque_impl_data._M_map,
                          (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_cur)->
                                  super_base_blob<256U>).m_data._M_elems + 1));
        }
      }
      if (dbp != (FlatFilePos *)0x0 &&
          blocks_with_unknown_parent !=
          (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
           *)0x0) {
        std::
        _Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
        ::_M_emplace_equal<uint256&,FlatFilePos&>
                  ((_Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                    *)blocks_with_unknown_parent,(uint256 *)auStack_84,dbp);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock38.super_unique_lock);
      iVar13 = 2;
    }
LAB_00402426:
  } while (iVar13 != 3);
LAB_00402886:
  if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d0._0_8_,(long)local_1c0 - local_1d0._0_8_);
  }
  lVar19 = std::chrono::_V2::steady_clock::now();
  _buf = (lVar19 - lVar14) / 1000000;
  logging_function_03._M_str = "LoadExternalBlockFile";
  logging_function_03._M_len = 0x15;
  source_file_03._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file_03._M_len = 0x5e;
  LogPrintFormatInternal<int,long>
            (logging_function_03,source_file_03,0x1448,ALL,Info,(ConstevalFormatString<2U>)0x80f3f9,
             &nLoaded,(long *)&buf);
LAB_00402917:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::LoadExternalBlockFile(
    AutoFile& file_in,
    FlatFilePos* dbp,
    std::multimap<uint256, FlatFilePos>* blocks_with_unknown_parent)
{
    // Either both should be specified (-reindex), or neither (-loadblock).
    assert(!dbp == !blocks_with_unknown_parent);

    const auto start{SteadyClock::now()};
    const CChainParams& params{GetParams()};

    int nLoaded = 0;
    try {
        BufferedFile blkdat{file_in, 2 * MAX_BLOCK_SERIALIZED_SIZE, MAX_BLOCK_SERIALIZED_SIZE + 8};
        // nRewind indicates where to resume scanning in case something goes wrong,
        // such as a block fails to deserialize.
        uint64_t nRewind = blkdat.GetPos();
        while (!blkdat.eof()) {
            if (m_interrupt) return;

            blkdat.SetPos(nRewind);
            nRewind++; // start one byte further next time, in case of failure
            blkdat.SetLimit(); // remove former limit
            unsigned int nSize = 0;
            try {
                // locate a header
                MessageStartChars buf;
                blkdat.FindByte(std::byte(params.MessageStart()[0]));
                nRewind = blkdat.GetPos() + 1;
                blkdat >> buf;
                if (buf != params.MessageStart()) {
                    continue;
                }
                // read size
                blkdat >> nSize;
                if (nSize < 80 || nSize > MAX_BLOCK_SERIALIZED_SIZE)
                    continue;
            } catch (const std::exception&) {
                // no valid block header found; don't complain
                // (this happens at the end of every blk.dat file)
                break;
            }
            try {
                // read block header
                const uint64_t nBlockPos{blkdat.GetPos()};
                if (dbp)
                    dbp->nPos = nBlockPos;
                blkdat.SetLimit(nBlockPos + nSize);
                CBlockHeader header;
                blkdat >> header;
                const uint256 hash{header.GetHash()};
                // Skip the rest of this block (this may read from disk into memory); position to the marker before the
                // next block, but it's still possible to rewind to the start of the current block (without a disk read).
                nRewind = nBlockPos + nSize;
                blkdat.SkipTo(nRewind);

                std::shared_ptr<CBlock> pblock{}; // needs to remain available after the cs_main lock is released to avoid duplicate reads from disk

                {
                    LOCK(cs_main);
                    // detect out of order blocks, and store them for later
                    if (hash != params.GetConsensus().hashGenesisBlock && !m_blockman.LookupBlockIndex(header.hashPrevBlock)) {
                        LogDebug(BCLog::REINDEX, "%s: Out of order block %s, parent %s not known\n", __func__, hash.ToString(),
                                 header.hashPrevBlock.ToString());
                        if (dbp && blocks_with_unknown_parent) {
                            blocks_with_unknown_parent->emplace(header.hashPrevBlock, *dbp);
                        }
                        continue;
                    }

                    // process in case the block isn't known yet
                    const CBlockIndex* pindex = m_blockman.LookupBlockIndex(hash);
                    if (!pindex || (pindex->nStatus & BLOCK_HAVE_DATA) == 0) {
                        // This block can be processed immediately; rewind to its start, read and deserialize it.
                        blkdat.SetPos(nBlockPos);
                        pblock = std::make_shared<CBlock>();
                        blkdat >> TX_WITH_WITNESS(*pblock);
                        nRewind = blkdat.GetPos();

                        BlockValidationState state;
                        if (AcceptBlock(pblock, state, nullptr, true, dbp, nullptr, true)) {
                            nLoaded++;
                        }
                        if (state.IsError()) {
                            break;
                        }
                    } else if (hash != params.GetConsensus().hashGenesisBlock && pindex->nHeight % 1000 == 0) {
                        LogDebug(BCLog::REINDEX, "Block Import: already had block %s at height %d\n", hash.ToString(), pindex->nHeight);
                    }
                }

                // Activate the genesis block so normal node progress can continue
                if (hash == params.GetConsensus().hashGenesisBlock) {
                    bool genesis_activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, nullptr)) {
                            genesis_activation_failure = true;
                            break;
                        }
                    }
                    if (genesis_activation_failure) {
                        break;
                    }
                }

                if (m_blockman.IsPruneMode() && m_blockman.m_blockfiles_indexed && pblock) {
                    // must update the tip for pruning to work while importing with -loadblock.
                    // this is a tradeoff to conserve disk space at the expense of time
                    // spent updating the tip to be able to prune.
                    // otherwise, ActivateBestChain won't be called by the import process
                    // until after all of the block files are loaded. ActivateBestChain can be
                    // called by concurrent network message processing. but, that is not
                    // reliable for the purpose of pruning while importing.
                    bool activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, pblock)) {
                            LogDebug(BCLog::REINDEX, "failed to activate chain (%s)\n", state.ToString());
                            activation_failure = true;
                            break;
                        }
                    }
                    if (activation_failure) {
                        break;
                    }
                }

                NotifyHeaderTip();

                if (!blocks_with_unknown_parent) continue;

                // Recursively process earlier encountered successors of this block
                std::deque<uint256> queue;
                queue.push_back(hash);
                while (!queue.empty()) {
                    uint256 head = queue.front();
                    queue.pop_front();
                    auto range = blocks_with_unknown_parent->equal_range(head);
                    while (range.first != range.second) {
                        std::multimap<uint256, FlatFilePos>::iterator it = range.first;
                        std::shared_ptr<CBlock> pblockrecursive = std::make_shared<CBlock>();
                        if (m_blockman.ReadBlockFromDisk(*pblockrecursive, it->second)) {
                            LogDebug(BCLog::REINDEX, "%s: Processing out of order child %s of %s\n", __func__, pblockrecursive->GetHash().ToString(),
                                    head.ToString());
                            LOCK(cs_main);
                            BlockValidationState dummy;
                            if (AcceptBlock(pblockrecursive, dummy, nullptr, true, &it->second, nullptr, true)) {
                                nLoaded++;
                                queue.push_back(pblockrecursive->GetHash());
                            }
                        }
                        range.first++;
                        blocks_with_unknown_parent->erase(it);
                        NotifyHeaderTip();
                    }
                }
            } catch (const std::exception& e) {
                // historical bugs added extra data to the block files that does not deserialize cleanly.
                // commonly this data is between readable blocks, but it does not really matter. such data is not fatal to the import process.
                // the code that reads the block files deals with invalid data by simply ignoring it.
                // it continues to search for the next {4 byte magic message start bytes + 4 byte length + block} that does deserialize cleanly
                // and passes all of the other block validation checks dealing with POW and the merkle root, etc...
                // we merely note with this informational log message when unexpected data is encountered.
                // we could also be experiencing a storage system read error, or a read of a previous bad write. these are possible, but
                // less likely scenarios. we don't have enough information to tell a difference here.
                // the reindex process is not the place to attempt to clean and/or compact the block files. if so desired, a studious node operator
                // may use knowledge of the fact that the block files are not entirely pristine in order to prepare a set of pristine, and
                // perhaps ordered, block files for later reindexing.
                LogDebug(BCLog::REINDEX, "%s: unexpected data at file offset 0x%x - %s. continuing\n", __func__, (nRewind - 1), e.what());
            }
        }
    } catch (const std::runtime_error& e) {
        GetNotifications().fatalError(strprintf(_("System error while loading external block file: %s"), e.what()));
    }
    LogPrintf("Loaded %i blocks from external file in %dms\n", nLoaded, Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}